

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxcbglxintegration.cpp
# Opt level: O1

QOpenGLContext * __thiscall
QXcbGlxIntegration::createOpenGLContext
          (QXcbGlxIntegration *this,GLXContext glxContext,void *visualInfo,
          QOpenGLContext *shareContext)

{
  QPlatformOpenGLContext *pQVar1;
  Display *display;
  QOpenGLContext *this_00;
  QGLXContext *this_01;
  QPlatformOpenGLContext *local_38;
  
  if (glxContext == (GLXContext)0x0) {
    this_00 = (QOpenGLContext *)0x0;
  }
  else {
    if (shareContext == (QOpenGLContext *)0x0) {
      local_38 = (QPlatformOpenGLContext *)0x0;
    }
    else {
      local_38 = (QPlatformOpenGLContext *)QOpenGLContext::handle();
    }
    this_00 = (QOpenGLContext *)operator_new(0x10);
    QOpenGLContext::QOpenGLContext(this_00,(QObject *)0x0);
    pQVar1 = *(QPlatformOpenGLContext **)(this_00 + 8);
    display = *(Display **)(this->m_connection + 0x10);
    this_01 = (QGLXContext *)operator_new(0x58);
    QGLXContext::QGLXContext(this_01,display,glxContext,visualInfo,local_38);
    QOpenGLContextPrivate::adopt(pQVar1);
  }
  return this_00;
}

Assistant:

QOpenGLContext *QXcbGlxIntegration::createOpenGLContext(GLXContext glxContext, void *visualInfo, QOpenGLContext *shareContext) const
{
    if (!glxContext)
        return nullptr;

    QPlatformOpenGLContext *shareHandle = shareContext ? shareContext->handle() : nullptr;

    auto *context = new QOpenGLContext;
    auto *contextPrivate = QOpenGLContextPrivate::get(context);
    auto *display = static_cast<Display *>(m_connection->xlib_display());
    contextPrivate->adopt(new QGLXContext(display, glxContext, visualInfo, shareHandle));
    return context;
}